

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::FenceVkImpl::Signal(FenceVkImpl *this,Uint64 Value)

{
  VkResult VVar1;
  string *this_00;
  string msg;
  string msg_1;
  _Alloc_hider local_58;
  void *pvStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  string local_38;
  
  this_00 = (string *)&local_58;
  if ((this->super_FenceBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>.
      m_Desc.Type != FENCE_TYPE_GENERAL) {
    FormatString<char[53]>
              ((string *)&local_58,
               (char (*) [53])"Fence must have been created with FENCE_TYPE_GENERAL");
    DebugAssertionFailed
              (local_58._M_p,"Signal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0x99);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    FormatString<char[89]>
              ((string *)&local_58,
               (char (*) [89])
               "Signal() is supported only with timeline semaphore, enable NativeFence feature to use it"
              );
    DebugAssertionFailed
              (local_58._M_p,"Signal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0xae);
  }
  else {
    FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
              (&this->super_FenceBase<Diligent::EngineVkImplTraits>,Value);
    pvStack_50 = (void *)0x0;
    local_58._M_p = (Char *)0x3b9df29d;
    local_48._M_allocated_capacity = (size_type)(this->m_TimelineSemaphore).m_VkObject;
    local_48._8_8_ = Value;
    VVar1 = VulkanUtilities::VulkanLogicalDevice::SignalSemaphore
                      ((((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                        .m_pDevice)->m_LogicalVkDevice).
                       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(VkSemaphoreSignalInfo *)&local_58);
    if (VVar1 == VK_SUCCESS) {
      return;
    }
    FormatString<char[36]>(&local_38,(char (*) [36])"Failed to signal timeline semaphore");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Signal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
               ,0xaa);
    this_00 = &local_38;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void FenceVkImpl::Signal(Uint64 Value)
{
    DEV_CHECK_ERR(m_Desc.Type == FENCE_TYPE_GENERAL, "Fence must have been created with FENCE_TYPE_GENERAL");

    if (IsTimelineSemaphore())
    {
        DvpSignal(Value);

        // SignalSemaphore() is thread safe

        VkSemaphoreSignalInfo SignalInfo{};
        SignalInfo.sType     = VK_STRUCTURE_TYPE_SEMAPHORE_SIGNAL_INFO;
        SignalInfo.pNext     = nullptr;
        SignalInfo.semaphore = m_TimelineSemaphore;
        SignalInfo.value     = Value;

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        VkResult err = LogicalDevice.SignalSemaphore(SignalInfo);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to signal timeline semaphore");
    }
    else
    {
        DEV_ERROR("Signal() is supported only with timeline semaphore, enable NativeFence feature to use it");
    }
}